

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int seek_pack(archive_read *a)

{
  long lVar1;
  int64_t iVar2;
  archive *in_RDI;
  int64_t pack_offset;
  _7zip *zip;
  int64_t in_stack_ffffffffffffffd8;
  archive_read *a_00;
  int local_4;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if (*(int *)(lVar1 + 0x114) == 0) {
    archive_set_error(in_RDI,-1,"Damaged 7-Zip archive");
    local_4 = -0x1e;
  }
  else {
    *(undefined8 *)(lVar1 + 0x118) =
         *(undefined8 *)(*(long *)(lVar1 + 0x10) + (ulong)*(uint *)(lVar1 + 0x110) * 8);
    a_00 = *(archive_read **)(*(long *)(lVar1 + 0x28) + (ulong)*(uint *)(lVar1 + 0x110) * 8);
    if (*(archive_read **)(lVar1 + 0xf8) != a_00) {
      iVar2 = __archive_read_seek(a_00,in_stack_ffffffffffffffd8,0);
      if (iVar2 < 0) {
        return -0x1e;
      }
      *(archive_read **)(lVar1 + 0xf8) = a_00;
    }
    *(int *)(lVar1 + 0x110) = *(int *)(lVar1 + 0x110) + 1;
    *(int *)(lVar1 + 0x114) = *(int *)(lVar1 + 0x114) + -1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
seek_pack(struct archive_read *a)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	int64_t pack_offset;

	if (zip->pack_stream_remaining <= 0) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->pack_stream_inbytes_remaining =
	    zip->si.pi.sizes[zip->pack_stream_index];
	pack_offset = zip->si.pi.positions[zip->pack_stream_index];
	if (zip->stream_offset != pack_offset) {
		if (0 > __archive_read_seek(a, pack_offset + zip->seek_base,
		    SEEK_SET))
			return (ARCHIVE_FATAL);
		zip->stream_offset = pack_offset;
	}
	zip->pack_stream_index++;
	zip->pack_stream_remaining--;
	return (ARCHIVE_OK);
}